

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,double&,double&>
          (pybind11 *this,double *args_,double *args__1)

{
  undefined8 uVar1;
  long lVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  array<pybind11::object,_2UL> args;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  argtypes;
  object local_b0;
  long local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_b0.super_handle.m_ptr = (handle)PyFloat_FromDouble(SUB84(*args_,0));
  local_a8 = PyFloat_FromDouble(SUB84(*args__1,0));
  __rhs = &local_40;
  if (local_b0.super_handle.m_ptr == (PyObject *)0x0) {
    __rhs = &local_60;
  }
  else if (local_a8 != 0) {
    tuple::tuple((tuple *)this,2);
    lVar2 = 0;
    do {
      uVar1 = *(undefined8 *)((long)&local_b0.super_handle.m_ptr + lVar2);
      *(undefined8 *)((long)&local_b0.super_handle.m_ptr + lVar2) = 0;
      if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) {
        __assert_fail("PyTuple_Check(result.ptr())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/pybind11/include/pybind11/cast.h"
                      ,0x6ee,
                      "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <double &, double &>]"
                     );
      }
      *(undefined8 *)(*(long *)this + 0x18 + lVar2) = uVar1;
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x10);
    lVar2 = 8;
    do {
      object::~object((object *)((long)&local_b0.super_handle.m_ptr + lVar2));
      lVar2 = lVar2 + -8;
    } while (lVar2 != -8);
    return (object)(object)this;
  }
  type_id<double&>();
  type_id<double&>();
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_a0,"make_tuple(): unable to convert argument of type \'",__rhs);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_a0);
  local_80 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_80 == plVar4) {
    local_70 = *plVar4;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar4;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_80);
  *(undefined ***)this_00 = &PTR__runtime_error_001abe98;
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}